

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::copyTexSubImage2D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int x,int y,
          int width,int height)

{
  pointer pTVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Texture2D *pTVar7;
  TextureCube *pTVar8;
  int iVar9;
  MultisampleConstPixelBufferAccess src;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  iVar9 = this->m_activeTexture;
  pTVar1 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if ((-1 < (yoffset | xoffset)) && (-1 < (height | width))) {
    if ((local_68.m_access.m_size.m_data[0] == 0) ||
       ((local_68.m_access.m_size.m_data[1] == 0 || (local_68.m_access.m_size.m_data[2] == 0)))) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if (target == 0xde1) {
      pTVar7 = &pTVar1[iVar9].default2DTex;
      if (pTVar1[iVar9].tex2DBinding != (Texture2D *)0x0) {
        pTVar7 = pTVar1[iVar9].tex2DBinding;
      }
      if (((uint)level < 0xe) &&
         (*(long *)((long)((pTVar7->m_levels).m_data + (uint)level) + 8) != 0)) {
        local_90.m_access.super_ConstPixelBufferAccess.m_format =
             *(TextureFormat *)((pTVar7->m_levels).m_access + (uint)level);
        lVar2 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar2] =
               *(int *)((long)((pTVar7->m_levels).m_access + (uint)level) + 8U + lVar2 * 4);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        lVar2 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar2] =
               *(int *)((long)((pTVar7->m_levels).m_access + (uint)level) + 0x14U + lVar2 * 4);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)((pTVar7->m_levels).m_access + (uint)level) + 0x20);
        if ((xoffset + width <= local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[0]) &&
           (yoffset + height <= local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[1])) {
          if (height < 1) {
            return;
          }
          iVar9 = 0;
          do {
            if (0 < width) {
              iVar4 = x;
              iVar5 = width;
              iVar6 = xoffset;
              do {
                if ((((-1 < iVar4) && (iVar4 < local_68.m_access.m_size.m_data[1])) &&
                    (-1 < iVar9 + y)) && (iVar9 + y < local_68.m_access.m_size.m_data[2])) {
                  rr::resolveMultisamplePixel
                            ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                             (int)&local_68,iVar4);
                  tcu::PixelBufferAccess::setPixel
                            (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar6,
                             yoffset + iVar9,0);
                }
                iVar6 = iVar6 + 1;
                iVar4 = iVar4 + 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != height);
          return;
        }
      }
    }
    else {
      if (5 < target - 0x8515) {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      pTVar8 = &pTVar1[iVar9].defaultCubeTex;
      if (pTVar1[iVar9].texCubeBinding != (TextureCube *)0x0) {
        pTVar8 = pTVar1[iVar9].texCubeBinding;
      }
      lVar2 = 6;
      if ((ushort)(target + 0x7aeb) < 6) {
        lVar2 = *(long *)(&DAT_01cf7258 + (ulong)(target + 0x7aeb & 0xffff) * 8);
      }
      if (((uint)level < 0xe) &&
         (*(long *)((long)(pTVar8->m_levels[lVar2].m_data + (uint)level) + 8) != 0)) {
        local_90.m_access.super_ConstPixelBufferAccess.m_format =
             *(TextureFormat *)(pTVar8->m_levels[lVar2].m_access + (uint)level);
        lVar3 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar3] =
               *(int *)((long)(pTVar8->m_levels[lVar2].m_access + (uint)level) + 8U + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar3] =
               *(int *)((long)(pTVar8->m_levels[lVar2].m_access + (uint)level) + 0x14U + lVar3 * 4);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)(pTVar8->m_levels[lVar2].m_access + (uint)level) + 0x20);
        if ((xoffset + width <= local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[0]) &&
           (yoffset + height <= local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[1])) {
          if (height < 1) {
            return;
          }
          iVar9 = 0;
          do {
            if (0 < width) {
              iVar4 = x;
              iVar5 = width;
              iVar6 = xoffset;
              do {
                if ((((-1 < iVar4) && (iVar4 < local_68.m_access.m_size.m_data[1])) &&
                    (-1 < iVar9 + y)) && (iVar9 + y < local_68.m_access.m_size.m_data[2])) {
                  rr::resolveMultisamplePixel
                            ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,
                             (int)&local_68,iVar4);
                  tcu::PixelBufferAccess::setPixel
                            (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,iVar6,
                             yoffset + iVar9,0);
                }
                iVar6 = iVar6 + 1;
                iVar4 = iVar4 + 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != height);
          return;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage2D (deUint32 target, int level, int xoffset, int yoffset, int x, int y, int width, int height)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0 || yoffset < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0,					GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),								GL_INVALID_OPERATION, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth() ||
					yoffset + height	> dst.getHeight(),
					GL_INVALID_VALUE, RC_RET_VOID);

		for (int yo = 0; yo < height; yo++)
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()) || !de::inBounds(y+yo, 0, src.raw().getDepth()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y+yo), xo+xoffset, yo+yoffset);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}